

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O0

void __thiscall QDialogPrivate::resetModalitySetByOpen(QDialogPrivate *this)

{
  bool bVar1;
  QWidget *this_00;
  QDialogPrivate *in_RDI;
  QDialog *q;
  bool in_stack_00000053;
  WidgetAttribute in_stack_00000054;
  QWidget *in_stack_00000058;
  QDialogPrivate *this_01;
  
  this_01 = in_RDI;
  this_00 = &q_func(in_RDI)->super_QWidget;
  if (in_RDI->resetModalityTo != -1) {
    bVar1 = QWidget::testAttribute((QWidget *)this_01,(WidgetAttribute)((ulong)this_00 >> 0x20));
    if (!bVar1) {
      QWidget::setWindowModality(this_00,(WindowModality)((ulong)in_RDI >> 0x20));
      QWidget::setAttribute(in_stack_00000058,in_stack_00000054,in_stack_00000053);
    }
  }
  in_RDI->resetModalityTo = -1;
  return;
}

Assistant:

void QDialogPrivate::resetModalitySetByOpen()
{
    Q_Q(QDialog);
    if (resetModalityTo != -1 && !q->testAttribute(Qt::WA_SetWindowModality)) {
        // open() changed the window modality and the user didn't touch it afterwards; restore it
        q->setWindowModality(Qt::WindowModality(resetModalityTo));
        q->setAttribute(Qt::WA_SetWindowModality, wasModalitySet);
#ifdef Q_OS_MAC
        Q_ASSERT(resetModalityTo != Qt::WindowModal);
        q->setParent(q->parentWidget(), Qt::Dialog);
#endif
    }
    resetModalityTo = -1;
}